

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressionSize.c
# Opt level: O1

int DoCompressionTest(IceTEnum color_format,IceTEnum depth_format,IceTEnum composite_mode)

{
  IceTSizeType IVar1;
  IceTSizeType IVar2;
  uint uVar3;
  uint uVar4;
  IceTEnum IVar5;
  int iVar6;
  IceTSizeType IVar7;
  void *buffer;
  IceTImage image;
  void *buffer_00;
  IceTSparseImage compressed_image;
  void *buffer_01;
  IceTSparseImage out_image;
  IceTUByte *pIVar8;
  IceTFloat *pIVar9;
  ulong uVar10;
  int iVar11;
  IceTUByte IVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  IceTSizeType depth_pixel_size;
  IceTSizeType color_pixel_size;
  IceTInt viewport [4];
  int local_80;
  uint local_50;
  uint local_4c;
  IceTInt local_48 [2];
  IceTSizeType local_40;
  IceTSizeType local_3c;
  
  printf("Using color format of 0x%x\n",(ulong)color_format);
  printf("Using depth format of 0x%x\n",depth_format);
  printf("Using composite mode of 0x%x\n",(ulong)composite_mode);
  icetSetColorFormat(color_format);
  icetSetDepthFormat(depth_format);
  icetCompositeMode(composite_mode);
  IVar1 = SCREEN_HEIGHT;
  IVar7 = SCREEN_WIDTH;
  printf("Allocating memory for %dx%d pixel image.\n");
  IVar2 = icetImageBufferSize(SCREEN_WIDTH,SCREEN_HEIGHT);
  buffer = malloc((long)IVar2);
  image = icetImageAssignBuffer(buffer,SCREEN_WIDTH,SCREEN_HEIGHT);
  uVar3 = icetSparseImageBufferSize(SCREEN_WIDTH,SCREEN_HEIGHT);
  buffer_00 = malloc((long)(int)uVar3);
  compressed_image = icetSparseImageAssignBuffer(buffer_00,SCREEN_WIDTH,SCREEN_HEIGHT);
  buffer_01 = malloc((long)(int)uVar3);
  out_image = icetSparseImageAssignBuffer(buffer_01,SCREEN_WIDTH,SCREEN_HEIGHT);
  icetImageGetColorVoid(image,(IceTSizeType *)&local_4c);
  icetImageGetDepthVoid(image,(IceTSizeType *)&local_50);
  uVar14 = local_50 + local_4c;
  printf("Pixel size: color=%d, depth=%d, total=%d\n",(ulong)local_4c,(ulong)local_50,(ulong)uVar14)
  ;
  puts("\nCreating worst possible image (with respect to compression).");
  uVar4 = icetImageGetNumPixels(image);
  IVar5 = icetImageGetColorFormat(image);
  if (IVar5 != 0xc000) {
    if (IVar5 == 0xc002) {
      pIVar9 = icetImageGetColorf(image);
      if (0 < (int)uVar4) {
        pIVar9 = pIVar9 + 3;
        uVar10 = 0;
        do {
          fVar15 = (float)((uint)uVar10 & 1);
          pIVar9[-3] = (IceTFloat)fVar15;
          pIVar9[-2] = (IceTFloat)fVar15;
          pIVar9[-1] = (IceTFloat)fVar15;
          *pIVar9 = (IceTFloat)fVar15;
          uVar10 = uVar10 + 1;
          pIVar9 = pIVar9 + 4;
        } while (uVar4 != uVar10);
      }
    }
    else if (IVar5 == 0xc001) {
      pIVar8 = icetImageGetColorub(image);
      if (0 < (int)uVar4) {
        uVar10 = 0;
        do {
          IVar12 = -((byte)uVar10 & 1);
          pIVar8[uVar10 * 4] = IVar12;
          pIVar8[uVar10 * 4 + 1] = IVar12;
          pIVar8[uVar10 * 4 + 2] = IVar12;
          pIVar8[uVar10 * 4 + 3] = IVar12;
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
    }
    else {
      puts("*** Unknown color format? ***");
    }
  }
  IVar5 = icetImageGetDepthFormat(image);
  if (IVar5 != 0xd000) {
    if (IVar5 == 0xd001) {
      pIVar9 = icetImageGetDepthf(image);
      if (0 < (int)uVar4) {
        uVar10 = 0;
        do {
          pIVar9[uVar10] = (IceTFloat)(float)((uint)uVar10 & 1);
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
    }
    else {
      puts("*** Unknown depth format? ***");
    }
  }
  puts("Compressing image.");
  icetCompressImage(image,compressed_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  iVar6 = (IVar1 * IVar7) / 2;
  iVar11 = uVar14 * iVar6;
  uVar13 = (uVar14 + 4) * iVar6;
  local_80 = 0;
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar13,(ulong)uVar4);
  if (((int)uVar3 < (int)uVar4) || ((int)uVar4 < iVar11)) {
    puts("*** Size differs from expected size!");
    local_80 = -3;
  }
  puts("Interlacing image.");
  icetSparseImageInterlace(compressed_image,0x61,0x1b0,out_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar13,(ulong)uVar4);
  if (((int)uVar3 < (int)uVar4) || ((int)uVar4 < iVar11)) {
    puts("*** Size differs from expected size!");
    local_80 = -3;
  }
  puts("\nCreating a different worst possible image.");
  InitActiveImage(image);
  puts("Compressing image.");
  icetCompressImage(image,compressed_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar3,(ulong)uVar4);
  iVar6 = uVar14 * IVar1 * IVar7;
  if (((int)uVar3 < (int)uVar4) || ((int)uVar4 < iVar6)) {
    puts("*** Size differs from expected size!");
    local_80 = -3;
  }
  puts("Interlacing image.");
  icetSparseImageInterlace(compressed_image,0x61,0x1b0,out_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar13,(ulong)uVar4);
  if (((int)uVar3 < (int)uVar4) || ((int)uVar4 < iVar11)) {
    puts("*** Size differs from expected size!");
    local_80 = -3;
  }
  puts("\nCompressing zero size image.");
  icetImageSetDimensions(image,0,0);
  icetCompressImage(image,compressed_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  uVar14 = icetSparseImageBufferSize(0,0);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar14,(ulong)uVar4);
  IVar7 = icetSparseImageBufferSize(0,0);
  if (IVar7 < (int)uVar4) {
    puts("*** Size differs from expected size!");
    local_80 = -3;
  }
  puts("\nSetup for actual render.");
  icetResetTiles();
  icetAddTile(0,0,SCREEN_WIDTH,SCREEN_HEIGHT,0);
  icetDrawCallback(drawCallback);
  icetDrawFrame(IdentityMatrix,IdentityMatrix,Black);
  local_48[0] = 0;
  local_48[1] = 0;
  local_40 = SCREEN_WIDTH;
  local_3c = SCREEN_HEIGHT;
  icetStateSetIntegerv(0x83,4,local_48);
  puts("Now render and get compressed image.");
  icetGetCompressedTileImage(0,compressed_image);
  uVar4 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar3,(ulong)uVar4);
  if (((int)uVar3 < (int)uVar4) || ((int)uVar4 < iVar6)) {
    puts("*** Size differs from expected size!");
    local_80 = -3;
  }
  puts("Cleaning up.");
  free(buffer);
  free(buffer_00);
  free(buffer_01);
  return local_80;
}

Assistant:

static int DoCompressionTest(IceTEnum color_format, IceTEnum depth_format,
                             IceTEnum composite_mode)
{
    IceTInt viewport[4];
    IceTSizeType pixels;
    IceTImage image;
    IceTVoid *imagebuffer;
    IceTSizeType imagesize;
    IceTSparseImage compressedimage;
    IceTVoid *compressedbuffer;
    IceTSparseImage interlacedimage;
    IceTVoid *interlacedbuffer;
    IceTSizeType compressedsize;
    IceTSizeType color_pixel_size;
    IceTSizeType depth_pixel_size;
    IceTSizeType pixel_size;
    IceTSizeType size;
    int result;

    result = TEST_PASSED;

    printf("Using color format of 0x%x\n", (int)color_format);
    printf("Using depth format of 0x%x\n", (int)depth_format);
    printf("Using composite mode of 0x%x\n", (int)composite_mode);

    icetSetColorFormat(color_format);
    icetSetDepthFormat(depth_format);
    icetCompositeMode(composite_mode);

    pixels = SCREEN_WIDTH*SCREEN_HEIGHT;

    printf("Allocating memory for %dx%d pixel image.\n",
           (int)SCREEN_WIDTH, (int)SCREEN_HEIGHT);
    imagesize = icetImageBufferSize(SCREEN_WIDTH, SCREEN_HEIGHT);
    imagebuffer = malloc(imagesize);
    image = icetImageAssignBuffer(imagebuffer, SCREEN_WIDTH, SCREEN_HEIGHT);

    compressedsize = icetSparseImageBufferSize(SCREEN_WIDTH, SCREEN_HEIGHT);
    compressedbuffer = malloc(compressedsize);
    compressedimage = icetSparseImageAssignBuffer(compressedbuffer,
                                                  SCREEN_WIDTH,
                                                  SCREEN_HEIGHT);

    interlacedbuffer = malloc(compressedsize);
    interlacedimage = icetSparseImageAssignBuffer(interlacedbuffer,
                                                  SCREEN_WIDTH,
                                                  SCREEN_HEIGHT);

  /* Get the number of bytes per pixel.  This is used in checking the
     size of compressed images. */
    icetImageGetColorVoid(image, &color_pixel_size);
    icetImageGetDepthVoid(image, &depth_pixel_size);
    pixel_size = color_pixel_size + depth_pixel_size;
    printf("Pixel size: color=%d, depth=%d, total=%d\n",
           (int)color_pixel_size, (int)depth_pixel_size, (int)pixel_size);

    printf("\nCreating worst possible image (with respect to compression).\n");
    InitPathologicalImage(image);

    printf("Compressing image.\n");
    icetCompressImage(image, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)(pixel_size*(pixels/2) + 2*sizeof(IceTUShort)*(pixels/2)),
           (int)size);
    if (   (size > compressedsize)
        || (size < pixel_size*(pixels/2)) ) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("Interlacing image.\n");
    icetSparseImageInterlace(compressedimage,
                             97,
                             ICET_SI_STRATEGY_BUFFER_0,
                             interlacedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)(pixel_size*(pixels/2) + 2*sizeof(IceTUShort)*(pixels/2)),
           (int)size);
    if (   (size > compressedsize)
        || (size < pixel_size*(pixels/2)) ) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("\nCreating a different worst possible image.\n");
    InitActiveImage(image);
    printf("Compressing image.\n");
    icetCompressImage(image, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)compressedsize, (int)size);
    if ((size > compressedsize) || (size < pixel_size*pixels)) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("Interlacing image.\n");
    icetSparseImageInterlace(compressedimage,
                             97,
                             ICET_SI_STRATEGY_BUFFER_0,
                             interlacedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)(pixel_size*(pixels/2) + 2*sizeof(IceTUShort)*(pixels/2)),
           (int)size);
    if (   (size > compressedsize)
        || (size < pixel_size*(pixels/2)) ) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("\nCompressing zero size image.\n");
    icetImageSetDimensions(image, 0, 0);
    icetCompressImage(image, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)icetSparseImageBufferSize(0, 0), (int)size);
    if (size > icetSparseImageBufferSize(0, 0)) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

  /* This test can be a little volatile.  The icetGetCompressedTileImage
   * expects certain things to be set correctly by the icetDrawFrame
   * function.  Since we want to call icetGetCompressedTileImage directly,
   * we try to set up these parameters by hand.  It is possible for this
   * test to incorrectly fail if the two functions are mutually changed and
   * this scaffolding is not updated correctly. */
    printf("\nSetup for actual render.\n");
    icetResetTiles();
    icetAddTile(0, 0, SCREEN_WIDTH, SCREEN_HEIGHT, 0);
    icetDrawCallback(drawCallback);
  /* Do a perfunctory draw to set other state variables. */
    icetDrawFrame(IdentityMatrix, IdentityMatrix, Black);
    viewport[0] = viewport[1] = 0;
    viewport[2] = (IceTInt)SCREEN_WIDTH;  viewport[3] = (IceTInt)SCREEN_HEIGHT;
    icetStateSetIntegerv(ICET_CONTAINED_VIEWPORT, 4, viewport);
    printf("Now render and get compressed image.\n");
    icetGetCompressedTileImage(0, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)compressedsize, (int)size);
    if ((size > compressedsize) || (size < pixel_size*pixels)) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("Cleaning up.\n");
    free(imagebuffer);
    free(compressedbuffer);
    free(interlacedbuffer);
    return result;
}